

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void lrtr_dbg(char *frmt,...)

{
  long lVar1;
  FILE *__stream;
  int iVar2;
  tm *ptVar3;
  time_t tVar4;
  long in_FS_OFFSET;
  bool local_81;
  _Bool fail;
  char *frmt_local;
  tm tm;
  timezone tz;
  timeval tv;
  va_list argptr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tv.tv_usec._4_4_ = 0x30;
  tv.tv_usec._0_4_ = 8;
  local_81 = true;
  iVar2 = gettimeofday((timeval *)&tz,(__timezone_ptr_t)&tm.tm_zone);
  if (iVar2 == 0) {
    ptVar3 = localtime_r((time_t *)&tz,(tm *)&frmt_local);
    if (ptVar3 != (tm *)0x0) {
      fprintf(_stderr,"(%04d/%02d/%02d %02d:%02d:%02d:%06ld): ",(ulong)(tm.tm_mday + 0x76c),
              (ulong)(tm.tm_hour + 1),(ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,frmt_local._4_4_
              ,frmt_local._0_4_,tv.tv_sec);
    }
    local_81 = ptVar3 == (tm *)0x0;
  }
  __stream = _stderr;
  if (local_81) {
    tVar4 = time((time_t *)0x0);
    fprintf(__stream,"(%jd): ",tVar4);
  }
  vfprintf(_stderr,frmt,&tv.tv_usec);
  fprintf(_stderr,"\n");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void lrtr_dbg(const char *frmt, ...)
{
#ifndef NDEBUG
	va_list argptr;
	struct timeval tv;
	struct timezone tz;

	va_start(argptr, frmt);

	bool fail = true;

	if (gettimeofday(&tv, &tz) == 0) {
		struct tm tm;

		if (localtime_r(&tv.tv_sec, &tm)) {
			fprintf(stderr, "(%04d/%02d/%02d %02d:%02d:%02d:%06ld): ", tm.tm_year + 1900, tm.tm_mon + 1,
				tm.tm_mday, tm.tm_hour, tm.tm_min, tm.tm_sec, tv.tv_usec);
			fail = false;
		}
	}

	if (fail)
		fprintf(stderr, "(%jd): ", (intmax_t)time(0));

	vfprintf(stderr, frmt, argptr);
	fprintf(stderr, "\n");
	va_end(argptr);
#endif
}